

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawChannel *pIVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ImDrawCmd *pIVar13;
  ImDrawCmd *pIVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  uVar20 = 0;
  SetCurrentChannel(this,draw_list,0);
  uVar10 = (draw_list->CmdBuffer).Size;
  lVar11 = (long)(int)uVar10;
  if (lVar11 == 0) {
    uVar9 = this->_Count;
    if (0 < (int)uVar9) goto LAB_0020494e;
LAB_00204a7f:
    iVar15 = 0;
    iVar18 = 0;
  }
  else {
    pIVar14 = (draw_list->CmdBuffer).Data;
    if ((pIVar14[lVar11 + -1].ElemCount == 0) &&
       (pIVar14[lVar11 + -1].UserCallback == (ImDrawCallback)0x0)) {
      uVar10 = uVar10 - 1;
      (draw_list->CmdBuffer).Size = uVar10;
    }
    uVar9 = this->_Count;
    uVar20 = uVar10;
    if ((int)uVar9 < 1) goto LAB_00204a7f;
    if ((int)uVar10 < 1) {
LAB_0020494e:
      pIVar13 = (ImDrawCmd *)0x0;
      iVar22 = 0;
    }
    else {
      pIVar14 = (draw_list->CmdBuffer).Data;
      pIVar13 = pIVar14 + ((ulong)uVar10 - 1);
      if (pIVar13 == (ImDrawCmd *)0x0) goto LAB_0020494e;
      iVar22 = pIVar14[(ulong)uVar10 - 1].ElemCount + pIVar14[(ulong)uVar10 - 1].IdxOffset;
    }
    if (uVar9 < 2) {
      iVar15 = 0;
      iVar18 = 0;
    }
    else {
      iVar18 = 0;
      lVar11 = 1;
      iVar15 = 0;
      do {
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar11;
        iVar21 = pIVar2[lVar11]._CmdBuffer.Size;
        uVar12 = (ulong)iVar21;
        if ((long)uVar12 < 1) {
LAB_00204a5c:
          iVar19 = (pIVar3->_IdxBuffer).Size;
        }
        else {
          pIVar14 = (pIVar3->_CmdBuffer).Data;
          if ((pIVar14[uVar12 - 1].ElemCount == 0) &&
             (pIVar14[uVar12 - 1].UserCallback == (ImDrawCallback)0x0)) {
            uVar12 = (ulong)(iVar21 - 1U);
            (pIVar3->_CmdBuffer).Size = iVar21 - 1U;
          }
          if (((int)uVar12 == 0) || (pIVar13 == (ImDrawCmd *)0x0)) {
LAB_00204a1e:
            iVar21 = (int)uVar12;
            if (iVar21 < 1) goto LAB_00204a5c;
          }
          else {
            pIVar14 = (pIVar3->_CmdBuffer).Data;
            auVar25[0] = -(*(char *)&(pIVar14->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
            auVar25[1] = -(*(char *)((long)&(pIVar14->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 1));
            auVar25[2] = -(*(char *)((long)&(pIVar14->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 2));
            auVar25[3] = -(*(char *)((long)&(pIVar14->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).x + 3));
            auVar25[4] = -(*(char *)&(pIVar14->ClipRect).y == *(char *)&(pIVar13->ClipRect).y);
            auVar25[5] = -(*(char *)((long)&(pIVar14->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 1));
            auVar25[6] = -(*(char *)((long)&(pIVar14->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 2));
            auVar25[7] = -(*(char *)((long)&(pIVar14->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).y + 3));
            auVar25[8] = -(*(char *)&(pIVar14->ClipRect).z == *(char *)&(pIVar13->ClipRect).z);
            auVar25[9] = -(*(char *)((long)&(pIVar14->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).z + 1));
            auVar25[10] = -(*(char *)((long)&(pIVar14->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar13->ClipRect).z + 2));
            auVar25[0xb] = -(*(char *)((long)&(pIVar14->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar13->ClipRect).z + 3));
            auVar25[0xc] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar13->ClipRect).w);
            auVar25[0xd] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 1));
            auVar25[0xe] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 2));
            auVar25[0xf] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar13->ClipRect).w + 3));
            auVar23[0] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar13->ClipRect).w);
            auVar23[1] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 1));
            auVar23[2] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 2));
            auVar23[3] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar13->ClipRect).w + 3));
            auVar23[4] = -(*(char *)&pIVar14->TextureId == *(char *)&pIVar13->TextureId);
            auVar23[5] = -(*(char *)((long)&pIVar14->TextureId + 1) ==
                          *(char *)((long)&pIVar13->TextureId + 1));
            auVar23[6] = -(*(char *)((long)&pIVar14->TextureId + 2) ==
                          *(char *)((long)&pIVar13->TextureId + 2));
            auVar23[7] = -(*(char *)((long)&pIVar14->TextureId + 3) ==
                          *(char *)((long)&pIVar13->TextureId + 3));
            auVar23[8] = -(*(char *)((long)&pIVar14->TextureId + 4) ==
                          *(char *)((long)&pIVar13->TextureId + 4));
            auVar23[9] = -(*(char *)((long)&pIVar14->TextureId + 5) ==
                          *(char *)((long)&pIVar13->TextureId + 5));
            auVar23[10] = -(*(char *)((long)&pIVar14->TextureId + 6) ==
                           *(char *)((long)&pIVar13->TextureId + 6));
            auVar23[0xb] = -(*(char *)((long)&pIVar14->TextureId + 7) ==
                            *(char *)((long)&pIVar13->TextureId + 7));
            auVar23[0xc] = -((char)pIVar14->VtxOffset == (char)pIVar13->VtxOffset);
            auVar23[0xd] = -(*(char *)((long)&pIVar14->VtxOffset + 1) ==
                            *(char *)((long)&pIVar13->VtxOffset + 1));
            auVar23[0xe] = -(*(char *)((long)&pIVar14->VtxOffset + 2) ==
                            *(char *)((long)&pIVar13->VtxOffset + 2));
            auVar23[0xf] = -(*(char *)((long)&pIVar14->VtxOffset + 3) ==
                            *(char *)((long)&pIVar13->VtxOffset + 3));
            auVar23 = auVar23 & auVar25;
            if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar14->UserCallback == (ImDrawCallback)0x0 &&
                pIVar13->UserCallback == (ImDrawCallback)0x0)) {
              pIVar13->ElemCount = pIVar13->ElemCount + pIVar14->ElemCount;
              iVar22 = iVar22 + pIVar14->ElemCount;
              pIVar14 = (pIVar3->_CmdBuffer).Data;
              memmove(pIVar14,pIVar14 + 1,(long)(pIVar3->_CmdBuffer).Size * 0x38 - 0x38);
              uVar10 = (pIVar3->_CmdBuffer).Size - 1;
              uVar12 = (ulong)uVar10;
              (pIVar3->_CmdBuffer).Size = uVar10;
              goto LAB_00204a1e;
            }
          }
          pIVar14 = (pIVar3->_CmdBuffer).Data;
          iVar21 = (int)uVar12;
          pIVar13 = pIVar14 + ((uVar12 & 0xffffffff) - 1);
          iVar19 = (pIVar3->_IdxBuffer).Size;
          lVar16 = 0;
          lVar17 = 0;
          do {
            *(int *)((long)&pIVar14->IdxOffset + lVar16) = iVar22;
            pIVar14 = (pIVar3->_CmdBuffer).Data;
            iVar22 = iVar22 + *(int *)((long)&pIVar14->ElemCount + lVar16);
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 0x38;
          } while (lVar17 < (pIVar3->_CmdBuffer).Size);
        }
        iVar15 = iVar15 + iVar19;
        iVar18 = iVar18 + iVar21;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->_Count);
      uVar20 = (draw_list->CmdBuffer).Size;
    }
  }
  iVar21 = uVar20 + iVar18;
  iVar22 = (draw_list->CmdBuffer).Capacity;
  if (iVar22 < iVar21) {
    if (iVar22 == 0) {
      iVar22 = 8;
    }
    else {
      iVar22 = iVar22 / 2 + iVar22;
    }
    if (iVar22 <= iVar21) {
      iVar22 = iVar21;
    }
    pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar22 * 0x38);
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14 != (ImDrawCmd *)0x0) {
      memcpy(pIVar13,pIVar14,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar13;
    (draw_list->CmdBuffer).Capacity = iVar22;
  }
  (draw_list->CmdBuffer).Size = iVar21;
  lVar11 = (long)(draw_list->IdxBuffer).Size + (long)iVar15;
  iVar22 = (draw_list->IdxBuffer).Capacity;
  iVar19 = (int)lVar11;
  if (iVar22 < iVar19) {
    if (iVar22 == 0) {
      iVar22 = 8;
    }
    else {
      iVar22 = iVar22 / 2 + iVar22;
    }
    if (iVar22 <= iVar19) {
      iVar22 = iVar19;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar22 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar22;
    iVar21 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar19;
  local_40 = local_40 + (lVar11 - iVar15);
  if (1 < this->_Count) {
    pIVar14 = (draw_list->CmdBuffer).Data + ((long)iVar21 - (long)iVar18);
    lVar16 = 1;
    lVar11 = 0x38;
    do {
      pIVar3 = (this->_Channels).Data;
      lVar17 = (long)*(int *)((long)pIVar3 + lVar11 + -0x18);
      if (lVar17 != 0) {
        memcpy(pIVar14,*(void **)((long)pIVar3 + lVar11 + -0x10),lVar17 * 0x38);
        pIVar14 = pIVar14 + lVar17;
      }
      lVar17 = (long)*(int *)((long)pIVar3 + lVar11 + -8);
      if (lVar17 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar11),lVar17 * 2);
        local_40 = local_40 + lVar17;
      }
      lVar16 = lVar16 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar16 < this->_Count);
    iVar21 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (iVar21 != 0) {
    pIVar14 = (draw_list->CmdBuffer).Data;
    lVar11 = (long)iVar21;
    if (pIVar14[lVar11 + -1].UserCallback == (ImDrawCallback)0x0) goto LAB_00204c69;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar14 = (draw_list->CmdBuffer).Data;
  lVar11 = (long)(draw_list->CmdBuffer).Size;
LAB_00204c69:
  pIVar13 = pIVar14 + lVar11 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar14[lVar11 + -1].ElemCount == 0) {
    fVar5 = (pIVar1->ClipRect).x;
    fVar6 = (pIVar1->ClipRect).y;
    fVar7 = (draw_list->_CmdHeader).ClipRect.z;
    fVar8 = (draw_list->_CmdHeader).ClipRect.w;
    uVar4 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar14[lVar11 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar14[lVar11 + -1].TextureId + 4) = uVar4;
    (pIVar13->ClipRect).x = fVar5;
    (pIVar13->ClipRect).y = fVar6;
    pIVar14[lVar11 + -1].ClipRect.z = fVar7;
    pIVar14[lVar11 + -1].ClipRect.w = fVar8;
  }
  else {
    auVar26[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
    auVar26[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.x + 1));
    auVar26[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.x + 2));
    auVar26[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.x + 3));
    auVar26[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar14[lVar11 + -1].ClipRect.y);
    auVar26[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.y + 1));
    auVar26[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.y + 2));
    auVar26[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.y + 3));
    auVar26[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar14[lVar11 + -1].ClipRect.z);
    auVar26[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.z + 1));
    auVar26[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.z + 2));
    auVar26[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.z + 3));
    auVar26[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar14[lVar11 + -1].ClipRect.w);
    auVar26[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 1));
    auVar26[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 2));
    auVar26[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 3));
    auVar24[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar14[lVar11 + -1].ClipRect.w);
    auVar24[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 1));
    auVar24[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 2));
    auVar24[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].ClipRect.w + 3));
    auVar24[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar14[lVar11 + -1].TextureId);
    auVar24[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 1));
    auVar24[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 2));
    auVar24[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 3));
    auVar24[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 4));
    auVar24[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 5));
    auVar24[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 6));
    auVar24[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].TextureId + 7));
    auVar24[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset == (char)pIVar14[lVar11 + -1].VtxOffset
                    );
    auVar24[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].VtxOffset + 1));
    auVar24[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].VtxOffset + 2));
    auVar24[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar14[lVar11 + -1].VtxOffset + 3));
    auVar24 = auVar24 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0 && ch._CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            // Do not include ImDrawCmd_AreSequentialIdxOffset() in the compare as we rebuild IdxOffset values ourselves.
            // Manipulating IdxOffset (e.g. by reordering draw commands like done by RenderDimmedBackgroundBehindWindow()) is not supported within a splitter.
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}